

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

void __thiscall SQVM::CallDebugHook(SQVM *this,SQInteger type,SQInteger forcedline)

{
  SQFunctionProto *this_00;
  SQInteger local_b0;
  SQInteger local_a8;
  _HashNode **local_a0;
  _HashNode **local_98;
  SQObjectPtr local_88;
  SQObjectPtr local_78 [2];
  long local_58;
  SQInteger nparams;
  SQObjectPtr temp_reg;
  SQInteger line;
  SQChar *fname;
  SQChar *src;
  SQFunctionProto *func;
  SQInteger forcedline_local;
  SQInteger type_local;
  SQVM *this_local;
  
  this->_debughook = false;
  this_00 = ((this->ci->_closure).super_SQObject._unVal.pClosure)->_function;
  if (this->_debughook_native == (SQDEBUGHOOK)0x0) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&nparams);
    local_58 = 5;
    Push(this,&this->_roottable);
    ::SQObjectPtr::SQObjectPtr(local_78,type);
    Push(this,local_78);
    ::SQObjectPtr::~SQObjectPtr(local_78);
    Push(this,&this_00->_sourcename);
    local_b0 = forcedline;
    if (forcedline == 0) {
      local_b0 = SQFunctionProto::GetLine(this_00,this->ci->_ip);
    }
    ::SQObjectPtr::SQObjectPtr(&local_88,local_b0);
    Push(this,&local_88);
    ::SQObjectPtr::~SQObjectPtr(&local_88);
    Push(this,&this_00->_name);
    Call(this,&this->_debughook_closure,local_58,this->_top - local_58,(SQObjectPtr *)&nparams,0);
    Pop(this,local_58);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&nparams);
  }
  else {
    if ((this_00->_sourcename).super_SQObject._type == OT_STRING) {
      local_98 = &((this_00->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      local_98 = (_HashNode **)0x0;
    }
    if ((this_00->_name).super_SQObject._type == OT_STRING) {
      local_a0 = &((this_00->_name).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      local_a0 = (_HashNode **)0x0;
    }
    local_a8 = forcedline;
    if (forcedline == 0) {
      local_a8 = SQFunctionProto::GetLine(this_00,this->ci->_ip);
    }
    temp_reg.super_SQObject._unVal.nInteger = local_a8;
    (*this->_debughook_native)(this,type,(SQChar *)local_98,local_a8,(SQChar *)local_a0);
  }
  this->_debughook = true;
  return;
}

Assistant:

void SQVM::CallDebugHook(SQInteger type,SQInteger forcedline)
{
    _debughook = false;
    SQFunctionProto *func=_closure(ci->_closure)->_function;
    if(_debughook_native) {
        const SQChar *src = sq_type(func->_sourcename) == OT_STRING?_stringval(func->_sourcename):NULL;
        const SQChar *fname = sq_type(func->_name) == OT_STRING?_stringval(func->_name):NULL;
        SQInteger line = forcedline?forcedline:func->GetLine(ci->_ip);
        _debughook_native(this,type,src,line,fname);
    }
    else {
        SQObjectPtr temp_reg;
        SQInteger nparams=5;
        Push(_roottable); Push(type); Push(func->_sourcename); Push(forcedline?forcedline:func->GetLine(ci->_ip)); Push(func->_name);
        Call(_debughook_closure,nparams,_top-nparams,temp_reg,SQFalse);
        Pop(nparams);
    }
    _debughook = true;
}